

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_subgraph.cc
# Opt level: O3

CommonSubgraphResult *
gss::solve_common_subgraph_problem
          (CommonSubgraphResult *__return_storage_ptr__,InputGraph *first,InputGraph *second,
          CommonSubgraphParams *params)

{
  pointer *pppVar1;
  _Rb_tree_header *p_Var2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  size_t *psVar3;
  pointer *pppVar4;
  _Rb_tree_header *p_Var5;
  element_type *peVar6;
  long lVar7;
  pair<int,_int> pVar8;
  undefined1 auVar9 [16];
  ulong uVar10;
  pointer piVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Base_ptr p_Var12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  SearchResult SVar20;
  size_t sVar21;
  _Head_base<0UL,_gss::RestartsSchedule_*,_false> _Var22;
  pointer ppVar23;
  _Rb_tree_node_base *p_Var24;
  _Node *p_Var25;
  mapped_type *pmVar26;
  _Base_ptr p_Var27;
  UnsupportedConfiguration *this_01;
  byte bVar28;
  pointer ppVar29;
  undefined1 *puVar30;
  ulong uVar31;
  pointer ppVar32;
  int iVar33;
  undefined1 *puVar34;
  ulong uVar35;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_02;
  size_type __rlen;
  size_type __rlen_2;
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  string_view sVar45;
  string_view sVar46;
  Proof *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_250 [2];
  loooong *local_240;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> assoc_encoding;
  undefined8 uStack_220;
  vector<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
  solution;
  SplitDomains domains;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> zero_in_proof_objectives;
  undefined8 uStack_1a0;
  CliqueResult clique_result;
  int iStack_10c;
  vector<int,_std::allocator<int>_> permitted;
  code *apcStack_f0 [2];
  _Head_base<0UL,_gss::RestartsSchedule_*,_false> local_e0;
  ulong local_d8;
  bool local_d0;
  _Any_data local_c8;
  _Base_ptr p_Stack_b8;
  _Base_ptr p_Stack_b0;
  _Optional_payload_base<gss::ProofOptions> local_a8;
  __shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> local_58;
  bool local_48;
  _Optional_payload_base<int> local_44;
  ulong local_38;
  undefined1 auVar38 [32];
  
  if ((params->count_solutions == true) &&
     ((params->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == false)) {
    this_01 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&permitted,"Solution counting only makes sense for decision problems","");
    UnsupportedConfiguration::UnsupportedConfiguration(this_01,(string *)&permitted);
    __cxa_throw(this_01,&UnsupportedConfiguration::typeinfo,
                UnsupportedConfiguration::~UnsupportedConfiguration);
  }
  local_258 = (Proof *)0x0;
  a_Stack_250[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((params->proof_options).super__Optional_base<gss::ProofOptions,_false,_false>._M_payload.
      super__Optional_payload<gss::ProofOptions,_true,_false,_false>.
      super__Optional_payload_base<gss::ProofOptions>._M_engaged == true) {
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_4_ = 0;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._4_4_ = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<gss::innards::Proof,std::allocator<gss::innards::Proof>,gss::ProofOptions_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish,(Proof **)&permitted,
               (allocator<gss::innards::Proof> *)&clique_result,
               (ProofOptions *)&params->proof_options);
    local_258 = (Proof *)CONCAT44(permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)permitted.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start);
    a_Stack_250[0]._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    iVar33 = 0;
    while( true ) {
      iVar15 = InputGraph::size(first);
      if (iVar15 <= iVar33) break;
      iVar15 = InputGraph::size(second);
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      clique_result.clique._M_t._M_impl._0_8_ = second;
      apcStack_f0[0] =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:365:17)>
           ::_M_invoke;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:366:17)>
           ::_M_invoke;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:365:17)>
                    ::_M_manager;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:366:17)>
           ::_M_manager;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)first;
      innards::Proof::create_cp_variable
                (local_258,iVar33,iVar15 + 1,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)&permitted,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)&clique_result);
      if (clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
          (_Base_ptr)0x0) {
        (*(code *)clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                  (&clique_result,&clique_result,3);
      }
      if (permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        (*(code *)permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage)
                  ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                    *)&permitted,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                    *)&permitted,3);
      }
      iVar33 = iVar33 + 1;
    }
    iVar33 = InputGraph::size(first);
    iVar15 = InputGraph::size(second);
    uVar35 = (ulong)(params->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_engaged;
    uVar31 = (ulong)(params->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_payload._M_value;
    if (uVar35 == 0) {
      uVar31 = 0;
    }
    innards::Proof::create_null_decision_bound
              (local_258,iVar33,iVar15,(optional<int>)(uVar31 | uVar35 << 0x20));
    iVar33 = InputGraph::size(first);
    iVar15 = InputGraph::size(second);
    innards::Proof::create_injectivity_constraints(local_258,iVar33,iVar15);
    iVar33 = 0;
    while( true ) {
      iVar15 = InputGraph::size(first);
      if (iVar15 <= iVar33) break;
      iVar15 = 0;
      while( true ) {
        iVar16 = InputGraph::size(second);
        if (iVar16 <= iVar15) break;
        bVar13 = InputGraph::adjacent(first,iVar33,iVar33);
        bVar14 = InputGraph::adjacent(second,iVar15,iVar15);
        if (bVar13 == bVar14) {
          sVar45 = InputGraph::vertex_label(first,iVar33);
          sVar21 = sVar45._M_len;
          sVar46 = InputGraph::vertex_label(second,iVar15);
          if (sVar21 != sVar46._M_len) goto LAB_001155b1;
          if (sVar21 != 0) {
            iVar16 = bcmp(sVar45._M_str,sVar46._M_str,sVar21);
            if (iVar16 != 0) goto LAB_001155b1;
          }
          innards::Proof::start_adjacency_constraints_for(local_258,iVar33,iVar15);
          iVar16 = 0;
          while( true ) {
            iVar17 = InputGraph::size(first);
            if (iVar17 <= iVar16) break;
            if (iVar16 != iVar33) {
              iVar17 = 0;
              permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0;
              permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = 0;
              permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              while( true ) {
                clique_result.clique._M_t._M_impl._0_4_ = iVar17;
                iVar18 = InputGraph::size(second);
                if (iVar18 <= iVar17) break;
                if (iVar15 != clique_result.clique._M_t._M_impl._0_4_) {
                  bVar13 = InputGraph::adjacent(first,iVar33,iVar16);
                  bVar14 = InputGraph::adjacent
                                     (second,iVar15,clique_result.clique._M_t._M_impl._0_4_);
                  if (bVar13 == bVar14) {
                    if (permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&permitted,
                                 (iterator)
                                 permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,(int *)&clique_result);
                    }
                    else {
                      *permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = clique_result.clique._M_t._M_impl._0_4_;
                      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                }
                iVar17 = clique_result.clique._M_t._M_impl._0_4_ + 1;
              }
              iVar17 = InputGraph::size(second);
              clique_result.clique._M_t._M_impl._0_4_ = iVar17;
              if (permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&permitted,
                           (iterator)
                           permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&clique_result);
              }
              else {
                *permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar17;
                permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              clique_result.clique._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
              innards::Proof::create_adjacency_constraint
                        (local_258,iVar33,iVar16,iVar15,&permitted,
                         (vector<int,_std::allocator<int>_> *)&clique_result,false);
              if (clique_result.clique._M_t._M_impl._0_8_ != 0) {
                operator_delete((void *)clique_result.clique._M_t._M_impl._0_8_,
                                (long)clique_result.clique._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent - clique_result.clique._M_t._M_impl._0_8_)
                ;
              }
              if (permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)permitted.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)permitted.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            iVar16 = iVar16 + 1;
          }
        }
        else {
LAB_001155b1:
          innards::Proof::create_forbidden_assignment_constraint(local_258,iVar33,iVar15);
        }
        iVar15 = iVar15 + 1;
      }
      iVar33 = iVar33 + 1;
    }
    if (params->connected != false) {
      iVar33 = InputGraph::size(first);
      iVar15 = InputGraph::size(second);
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      apcStack_f0[0] =
           std::
           _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:401:78)>
           ::_M_invoke;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:401:78)>
                    ::_M_manager;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)first;
      innards::Proof::create_connected_constraints
                (local_258,iVar33,iVar15,(function<bool_(int,_int)> *)&permitted);
      if (permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        (*(code *)permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage)(&permitted,&permitted,3);
      }
    }
    innards::Proof::finalise_model(local_258);
    if ((params->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      pppVar1 = &assoc_encoding.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      pppVar4 = &zero_in_proof_objectives.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar33 = 0;
      solution.
      super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      solution.
      super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      solution.
      super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while( true ) {
        iVar15 = InputGraph::size(first);
        if (iVar15 <= iVar33) break;
        iVar15 = 0;
        while( true ) {
          iVar16 = InputGraph::size(second);
          if (iVar16 <= iVar15) break;
          InputGraph::vertex_name_abi_cxx11_((string *)&assoc_encoding,first,iVar33);
          permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)apcStack_f0;
          if (assoc_encoding.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start == (pointer)pppVar1) {
            apcStack_f0[1] = (code *)uStack_220;
          }
          else {
            permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = &(assoc_encoding.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first;
          }
          apcStack_f0[0] =
               (code *)assoc_encoding.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               &(assoc_encoding.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->first;
          assoc_encoding.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          assoc_encoding.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pppVar1;
          assoc_encoding.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)assoc_encoding.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_4_ = iVar33;
          InputGraph::vertex_name_abi_cxx11_((string *)&zero_in_proof_objectives,second,iVar15);
          clique_result.clique._M_t._M_impl._0_4_ = iVar15;
          clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               zero_in_proof_objectives.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          if (zero_in_proof_objectives.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start == (pointer)pppVar4) {
            clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)uStack_1a0;
            clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 &clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               zero_in_proof_objectives.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               zero_in_proof_objectives.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          zero_in_proof_objectives.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          zero_in_proof_objectives.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pppVar4;
          zero_in_proof_objectives.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)zero_in_proof_objectives.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          auVar9[0xf] = 0;
          auVar9._0_15_ =
               (undefined1  [15])
               domains.partitions.
               super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._1_15_;
          domains.partitions.
          super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._0_16_ = auVar9 << 8;
          std::
          vector<std::tuple<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>,std::allocator<std::tuple<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>>>
          ::
          emplace_back<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>
                    ((vector<std::tuple<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>,std::allocator<std::tuple<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>>>
                      *)&solution,
                     (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&permitted,
                     (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&clique_result,(bool *)&domains);
          if ((_Base_ptr *)clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
              != &clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
            operator_delete((void *)clique_result.clique._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._0_8_,
                            (ulong)((long)&(clique_result.clique._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_left)->_M_color + 1));
          }
          if (zero_in_proof_objectives.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)pppVar4) {
            operator_delete(zero_in_proof_objectives.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&(zero_in_proof_objectives.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + 1));
          }
          if ((code **)permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish != apcStack_f0) {
            operator_delete(permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish,(long)apcStack_f0[0] + 1);
          }
          if (assoc_encoding.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)pppVar1) {
            operator_delete(assoc_encoding.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&(assoc_encoding.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + 1));
          }
          iVar15 = iVar15 + 1;
        }
        iVar33 = iVar33 + 1;
      }
      innards::Proof::new_incumbent(local_258,&solution);
      iVar33 = InputGraph::size(first);
      innards::Proof::rewrite_mcs_objective(local_258,iVar33);
      std::
      vector<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
      ::~vector(&solution);
    }
  }
  if (params->clique == true) {
    apcStack_f0[0]._0_5_ = CONCAT14(0,apcStack_f0[0]._0_4_);
    apcStack_f0[1]._0_5_ = CONCAT14(0,apcStack_f0[1]._0_4_);
    local_e0._M_head_impl = (RestartsSchedule *)0x0;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_d8 = 0x1ffffffff;
    local_d0 = false;
    local_c8._M_unused._M_object =
         (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0;
    local_c8._8_8_ = (InputGraph *)0x0;
    p_Stack_b8 = (_Base_ptr)0x0;
    p_Stack_b0 = (_Base_ptr)0x0;
    local_a8._M_engaged = false;
    local_44._M_engaged = false;
    local_58._M_ptr = (element_type *)0x0;
    local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48 = false;
    peVar6 = (params->timeout).super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_4_ = (int)peVar6;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._4_4_ = (undefined4)((ulong)peVar6 >> 0x20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &(params->timeout).super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(params->start_time).__d.__r;
    apcStack_f0[0] =
         *(code **)&(params->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>;
    _Var22._M_head_impl = (RestartsSchedule *)operator_new(8);
    *_Var22._M_head_impl = (RestartsSchedule)&PTR__RestartsSchedule_001608c8;
    if ((_Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>)
        local_e0._M_head_impl != (RestartsSchedule *)0x0) {
      lVar7 = *(long *)local_e0._M_head_impl;
      local_e0._M_head_impl = _Var22._M_head_impl;
      (**(code **)(lVar7 + 8))();
      _Var22._M_head_impl = local_e0._M_head_impl;
    }
    local_e0._M_head_impl = _Var22._M_head_impl;
    uVar19 = InputGraph::size(first);
    local_44 = (_Optional_payload_base<int>)((ulong)uVar19 | 0x100000000);
    iVar33 = 0;
    InputGraph::InputGraph((InputGraph *)&solution,0,false,false);
    assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    zero_in_proof_objectives.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    zero_in_proof_objectives.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    zero_in_proof_objectives.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      clique_result.clique._M_t._M_impl._0_4_ = iVar33;
      iVar15 = InputGraph::size(first);
      if (iVar15 <= iVar33) break;
      iVar33 = 0;
      while( true ) {
        domains.partitions.
        super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar33;
        iVar15 = InputGraph::size(second);
        if (iVar15 <= iVar33) break;
        bVar13 = InputGraph::adjacent
                           (first,clique_result.clique._M_t._M_impl._0_4_,
                            clique_result.clique._M_t._M_impl._0_4_);
        bVar14 = InputGraph::adjacent
                           (second,(int)domains.partitions.
                                        super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                            (int)domains.partitions.
                                 super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        if (bVar13 == bVar14) {
          sVar45 = InputGraph::vertex_label(first,clique_result.clique._M_t._M_impl._0_4_);
          sVar21 = sVar45._M_len;
          sVar46 = InputGraph::vertex_label
                             (second,(int)domains.partitions.
                                          super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
          if (sVar21 != sVar46._M_len) goto LAB_00115bdf;
          this_02 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&assoc_encoding
          ;
          if (sVar21 != 0) {
            iVar33 = bcmp(sVar45._M_str,sVar46._M_str,sVar21);
            this_02 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                      &assoc_encoding;
            if (iVar33 != 0) goto LAB_00115bdf;
          }
LAB_00115bea:
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>(this_02,(int *)&clique_result,(int *)&domains);
        }
        else {
LAB_00115bdf:
          this_02 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                    &zero_in_proof_objectives;
          if (local_258 != (Proof *)0x0) goto LAB_00115bea;
        }
        iVar33 = (int)domains.partitions.
                      super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      iVar33 = clique_result.clique._M_t._M_impl._0_4_ + 1;
    }
    if (local_258 != (Proof *)0x0) {
      innards::Proof::create_clique_encoding(local_258,&assoc_encoding,&zero_in_proof_objectives);
    }
    InputGraph::resize((InputGraph *)&solution,
                       (int)((ulong)((long)assoc_encoding.
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)assoc_encoding.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
    if (assoc_encoding.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        assoc_encoding.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_240 = (loooong *)0x0;
      do {
        if (assoc_encoding.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            assoc_encoding.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start) break;
        puVar34 = (undefined1 *)0x0;
        ppVar23 = assoc_encoding.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          iVar33 = (int)puVar34;
          if ((int)local_240 != iVar33) {
            pVar8 = ppVar23[(long)puVar34];
            iVar15 = ppVar23[(long)local_240].first;
            iVar16 = pVar8.first;
            if (iVar15 != iVar16) {
              local_38 = (ulong)pVar8 >> 0x20;
              iVar17 = ppVar23[(long)local_240].second;
              if (iVar17 != pVar8.second) {
                bVar13 = InputGraph::adjacent(first,iVar15,iVar16);
                bVar14 = InputGraph::adjacent(second,iVar17,(int)local_38);
                if (bVar13 == bVar14) {
                  bVar13 = InputGraph::adjacent(first,iVar15,iVar16);
                  if (bVar13) {
                    sVar45 = InputGraph::edge_label(first,iVar15,iVar16);
                    sVar21 = sVar45._M_len;
                    sVar46 = InputGraph::edge_label(second,iVar17,(int)local_38);
                    if ((sVar21 != sVar46._M_len) ||
                       ((sVar21 != 0 &&
                        (iVar15 = bcmp(sVar45._M_str,sVar46._M_str,sVar21), iVar15 != 0))))
                    goto LAB_00115d23;
                  }
                  InputGraph::add_edge((InputGraph *)&solution,(int)local_240,iVar33);
                  goto LAB_00115da6;
                }
              }
            }
LAB_00115d23:
            if (local_258 != (Proof *)0x0) {
              innards::Proof::create_clique_nonedge(local_258,(int)local_240,iVar33);
            }
          }
LAB_00115da6:
          puVar34 = (undefined1 *)(ulong)(iVar33 + 1);
          puVar30 = (undefined1 *)
                    ((long)assoc_encoding.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)assoc_encoding.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
          ppVar23 = assoc_encoding.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (puVar34 < puVar30);
        local_240 = (loooong *)(ulong)((int)local_240 + 1);
      } while (local_240 < puVar30);
    }
    local_58._M_ptr = local_258;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_58._M_refcount,a_Stack_250);
    p_Var12 = p_Stack_b0;
    p_Var27 = p_Stack_b8;
    if (params->connected != false) {
      p_Stack_b8 = (_Base_ptr)
                   std::
                   _Function_handler<gss::innards::SVOBitset_(int,_const_std::function<int_(int)>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:462:39)>
                   ::_M_manager;
      p_Stack_b0 = (_Base_ptr)
                   std::
                   _Function_handler<gss::innards::SVOBitset_(int,_const_std::function<int_(int)>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:462:39)>
                   ::_M_invoke;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_c8._8_8_;
      clique_result.clique._M_t._M_impl._0_8_ = local_c8._M_unused._0_8_;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var27;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var12;
      local_c8._M_unused._M_object = &assoc_encoding;
      local_c8._8_8_ = first;
      if (p_Var27 != (_Base_ptr)0x0) {
        (*(code *)p_Var27)(&clique_result,&clique_result,3);
      }
    }
    solve_clique_problem(&clique_result,(InputGraph *)&solution,(CliqueParams *)&permitted);
    p_Var2 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header;
    this = &__return_storage_ptr__->extra_stats;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
    ;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    *(undefined1 (*) [16])
     &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (undefined1  [16])0x0;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    __return_storage_ptr__->complete = false;
    for (p_Var24 = clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var24 != &clique_result.clique._M_t._M_impl.super__Rb_tree_header;
        p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24)) {
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_unique<std::pair<int,int>&>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)__return_storage_ptr__,
                 assoc_encoding.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + (int)p_Var24[1]._M_color);
    }
    __return_storage_ptr__->nodes = clique_result.nodes;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(this,&clique_result.extra_stats);
    p_Var25 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_create_node<char_const(&)[26]>
                        ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                         (char (*) [26])"used_clique_solver = true");
    std::__detail::_List_node_base::_M_hook(&p_Var25->super__List_node_base);
    psVar3 = &(__return_storage_ptr__->extra_stats).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar3 = *psVar3 + 1;
    __return_storage_ptr__->complete = clique_result.complete;
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&clique_result.extra_stats.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &clique_result);
    if (zero_in_proof_objectives.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(zero_in_proof_objectives.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)zero_in_proof_objectives.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)zero_in_proof_objectives.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (assoc_encoding.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(assoc_encoding.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)assoc_encoding.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)assoc_encoding.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    InputGraph::~InputGraph((InputGraph *)&solution);
    if (local_58._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_refcount._M_pi);
    }
    if (local_a8._M_engaged == true) {
      std::_Optional_payload_base<gss::ProofOptions>::_M_destroy(&local_a8);
    }
    if (p_Stack_b8 != (_Base_ptr)0x0) {
      (*(code *)p_Stack_b8)(&local_c8,&local_c8,3);
    }
    if (local_e0._M_head_impl != (RestartsSchedule *)0x0) {
      (*(local_e0._M_head_impl)->_vptr_RestartsSchedule[1])();
    }
    local_e0._M_head_impl = (RestartsSchedule *)0x0;
    this_00._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    goto joined_r0x001165bc;
  }
  solution.
  super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)second;
  solution.
  super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)first;
  if (a_Stack_250[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_250[0]._M_pi)->_M_use_count = (a_Stack_250[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_250[0]._M_pi)->_M_use_count = (a_Stack_250[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_240 = &__return_storage_ptr__->solution_count;
  p_Var2 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header;
  psVar3 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var5 = &clique_result.clique._M_t._M_impl.super__Rb_tree_header;
  iVar33 = 0;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  *(undefined1 (*) [16])
   &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (__return_storage_ptr__->extra_stats).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&__return_storage_ptr__->extra_stats;
  (__return_storage_ptr__->extra_stats).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&__return_storage_ptr__->extra_stats;
  (__return_storage_ptr__->extra_stats).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  __return_storage_ptr__->complete = false;
  clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  solution.
  super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)params;
  clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
  clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
  while( true ) {
    assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = iVar33;
    iVar15 = InputGraph::size((InputGraph *)
                              solution.
                              super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    if (iVar15 <= iVar33) break;
    bVar13 = InputGraph::adjacent
                       ((InputGraph *)
                        solution.
                        super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (int)assoc_encoding.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                        (int)assoc_encoding.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    sVar45 = InputGraph::vertex_label
                       ((InputGraph *)
                        solution.
                        super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (int)assoc_encoding.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_1_ = bVar13;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)sVar45._M_len;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)sVar45._M_str;
    pmVar26 = std::
              map<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
              ::operator[]((map<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                            *)&clique_result,(key_type *)&permitted);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)pmVar26,
               (int *)&assoc_encoding);
    iVar33 = (int)assoc_encoding.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
  }
  iVar33 = 0;
  while( true ) {
    assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = iVar33;
    iVar15 = InputGraph::size((InputGraph *)
                              solution.
                              super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
    if (iVar15 <= iVar33) break;
    bVar13 = InputGraph::adjacent
                       ((InputGraph *)
                        solution.
                        super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        (int)assoc_encoding.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                        (int)assoc_encoding.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    sVar45 = InputGraph::vertex_label
                       ((InputGraph *)
                        solution.
                        super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        (int)assoc_encoding.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_1_ = bVar13;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)sVar45._M_len;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)sVar45._M_str;
    pmVar26 = std::
              map<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
              ::operator[]((map<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                            *)&clique_result,(key_type *)&permitted);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &pmVar26->second,(int *)&assoc_encoding);
    iVar33 = (int)assoc_encoding.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
  }
  domains.partitions.
  super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  domains.partitions.
  super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  domains.partitions.
  super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  piVar11 = permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if ((_Rb_tree_header *)clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      != p_Var5) {
    p_Var27 = clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if ((*(long *)(p_Var27 + 3) != 0) && (p_Var27[4]._M_left != (_Base_ptr)0x0)) {
        std::
        vector<std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>>>
        ::
        emplace_back<std::set<int,std::less<int>,std::allocator<int>>&,std::set<int,std::less<int>,std::allocator<int>>&>
                  ((vector<std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>>>
                    *)&domains,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)&p_Var27[1]._M_right,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)&p_Var27[3]._M_parent);
      }
      p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27);
      piVar11 = permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while ((_Rb_tree_header *)p_Var27 != p_Var5);
  }
  permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
  assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  zero_in_proof_objectives.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0);
  zero_in_proof_objectives.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar28 = *(byte *)((long)&((solution.
                              super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                            ).
                            super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                            .
                            super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_head_impl.second._M_string_length + 4);
  if ((bVar28 == 1) &&
     ((int)((solution.
             super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
           super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
           ).
           super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
           .
           super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
           ._M_head_impl.second._M_string_length != 1)) {
    uVar19 = 1;
    iVar33 = -1;
    do {
      iStack_10c = iVar33;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = iVar33;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 &zero_in_proof_objectives,(int *)&permitted,&iStack_10c);
      piVar11 = (pointer)CONCAT44(permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)permitted.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start);
      uVar19 = uVar19 + 1;
      iVar33 = iVar33 + -1;
    } while (uVar19 <= (int)((solution.
                              super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                            ).
                            super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                            .
                            super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_head_impl.second._M_string_length - 1U);
    bVar28 = *(byte *)((long)&((solution.
                                super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                              ).
                              super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                              .
                              super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                              ._M_head_impl.second._M_string_length + 4);
  }
  permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       piVar11;
  if ((bVar28 & 1) == 0) {
LAB_001163ea:
    local_d8 = local_d8 & 0xffffffffffffff00;
    SVar20 = anon_unknown.dwarf_6e1b4::CommonSubgraphRunner::search
                       ((CommonSubgraphRunner *)&solution,0,(Assignments *)&assoc_encoding,
                        (Assignments *)&zero_in_proof_objectives,&domains,
                        &__return_storage_ptr__->nodes,local_240,
                        (optional<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)&permitted
                       );
    if ((char)local_d8 == '\x01') {
      local_d8 = local_d8 & 0xffffffffffffff00;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &permitted);
    }
    ppVar23 = zero_in_proof_objectives.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish;
    if (SVar20 == Complete) {
      __return_storage_ptr__->complete = true;
      ppVar32 = zero_in_proof_objectives.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*(char *)((long)&((solution.
                             super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                           ).
                           super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                           .
                           super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                           ._M_head_impl.second._M_string_length + 4) == '\0') {
        for (; ppVar32 != ppVar23; ppVar32 = ppVar32 + 1) {
          std::
          _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
          ::_M_emplace_unique<int&,int&>
                    ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                      *)__return_storage_ptr__,&ppVar32->first,&ppVar32->second);
        }
      }
    }
    else if (SVar20 == DecidedTrue) {
      __return_storage_ptr__->complete = true;
      for (ppVar32 = zero_in_proof_objectives.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppVar32 != ppVar23;
          ppVar32 = ppVar32 + 1) {
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_emplace_unique<int&,int&>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)__return_storage_ptr__,&ppVar32->first,&ppVar32->second);
      }
    }
    else if (SVar20 == SatisfiableButKeepGoing) {
      __return_storage_ptr__->complete = true;
    }
LAB_001164d5:
    if (local_258 != (Proof *)0x0) {
      if (*(char *)((long)&((solution.
                             super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                           ).
                           super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                           .
                           super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                           ._M_head_impl.second._M_string_length + 4) == '\x01') {
        if ((__return_storage_ptr__->complete != false) && (*psVar3 == 0)) {
          innards::Proof::finish_unsat_proof(local_258);
        }
      }
      else if (__return_storage_ptr__->complete != false) {
        iVar33 = InputGraph::size((InputGraph *)
                                  solution.
                                  super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
        innards::Proof::finish_optimisation_proof(local_258,iVar33 - (int)*psVar3);
      }
    }
  }
  else {
    if (domains.partitions.
        super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        domains.partitions.
        super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar19 = 0;
    }
    else {
      auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      vpmovsxwd_avx2(_DAT_00148640);
      vpmovsxwd_avx2(_DAT_00148650);
      uVar35 = 0;
      auVar40 = vpbroadcastq_avx512f();
      auVar41 = vpsrlq_avx512f(auVar40,6);
      uVar31 = (ulong)((long)domains.partitions.
                             super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish +
                      (-0x60 - (long)domains.partitions.
                                     super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)) / 0x60 + 8 &
               0xfffffffffffffff8;
      ppVar29 = domains.partitions.
                super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar40 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar44 = auVar40;
        auVar40 = vpbroadcastq_avx512f();
        uVar35 = uVar35 + 8;
        auVar40 = vporq_avx512f(auVar40,auVar39);
        uVar10 = vpcmpuq_avx512f(auVar40,auVar41,2);
        auVar40 = vpgatherdq_avx512f(*(undefined4 *)
                                      ((long)&(ppVar29->first)._M_t._M_impl.super__Rb_tree_header.
                                              _M_node_count + uVar31));
        bVar28 = (byte)uVar10;
        auVar42._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar40._8_8_;
        auVar42._0_8_ = (ulong)(bVar28 & 1) * auVar40._0_8_;
        auVar42._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar40._16_8_;
        auVar42._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar40._24_8_;
        auVar42._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * auVar40._32_8_;
        auVar42._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * auVar40._40_8_;
        auVar42._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * auVar40._48_8_;
        auVar42._56_8_ = (uVar10 >> 7) * auVar40._56_8_;
        auVar40 = vpgatherdq_avx512f(*(undefined4 *)&(ppVar29->first)._M_t._M_impl);
        auVar43._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar40._8_8_;
        auVar43._0_8_ = (ulong)(bVar28 & 1) * auVar40._0_8_;
        auVar43._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar40._16_8_;
        auVar43._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar40._24_8_;
        auVar43._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * auVar40._32_8_;
        auVar43._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * auVar40._40_8_;
        auVar43._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * auVar40._48_8_;
        auVar43._56_8_ = (uVar10 >> 7) * auVar40._56_8_;
        ppVar29 = ppVar29 + 8;
        auVar40 = vpminuq_avx512f(auVar43,auVar42);
        auVar37 = vpmovqd_avx512f(auVar40);
        auVar37 = vpaddd_avx2(auVar44._0_32_,auVar37);
        auVar40 = ZEXT3264(auVar37);
      } while (uVar31 != uVar35);
      auVar37 = vmovdqa32_avx512vl(auVar37);
      auVar36._0_4_ = (uint)(bVar28 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar44._0_4_
      ;
      bVar13 = (bool)((byte)(uVar10 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar44._4_4_;
      bVar13 = (bool)((byte)(uVar10 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar44._8_4_;
      bVar13 = (bool)((byte)(uVar10 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar44._12_4_;
      bVar13 = (bool)((byte)(uVar10 >> 4) & 1);
      auVar38._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar44._16_4_;
      auVar38._0_16_ = auVar36;
      bVar13 = (bool)((byte)(uVar10 >> 5) & 1);
      auVar38._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar44._20_4_;
      bVar13 = (bool)((byte)(uVar10 >> 6) & 1);
      auVar38._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar44._24_4_;
      bVar13 = SUB81(uVar10 >> 7,0);
      auVar38._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar44._28_4_;
      auVar9 = vphaddd_avx(auVar38._16_16_,auVar36);
      auVar9 = vphaddd_avx(auVar9,auVar9);
      auVar9 = vphaddd_avx(auVar9,auVar9);
      uVar19 = auVar9._0_4_;
    }
    if ((uint)((solution.
                super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
              super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
              ).
              super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
              .
              super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_head_impl.second._M_string_length <= uVar19) goto LAB_001163ea;
    __return_storage_ptr__->complete = true;
    if (local_258 != (Proof *)0x0) {
      innards::Proof::mcs_bound(local_258,&domains.partitions);
      goto LAB_001164d5;
    }
  }
  if (zero_in_proof_objectives.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(zero_in_proof_objectives.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)zero_in_proof_objectives.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)zero_in_proof_objectives.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(assoc_encoding.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)assoc_encoding.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)assoc_encoding.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~vector(&domains.partitions);
  std::
  _Rb_tree<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::_Select1st<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::_Select1st<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
               *)&clique_result);
  this_00._M_pi = a_Stack_250[0]._M_pi;
joined_r0x001165bc:
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (a_Stack_250[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_250[0]._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto gss::solve_common_subgraph_problem(const InputGraph & first, const InputGraph & second,
    const CommonSubgraphParams & params) -> CommonSubgraphResult
{
    if (params.count_solutions && ! params.decide)
        throw UnsupportedConfiguration{"Solution counting only makes sense for decision problems"};

    shared_ptr<Proof> proof;
    if (params.proof_options) {
        proof = make_shared<Proof>(*params.proof_options);

        for (int n = 0; n < first.size(); ++n) {
            proof->create_cp_variable(
                n, second.size() + 1,
                [&](int v) { return first.vertex_name(v); },
                [&](int v) { if (v == second.size()) return string("null"); else return second.vertex_name(v); });
        }

        proof->create_null_decision_bound(first.size(), second.size(), params.decide);

        // generate constraints for injectivity
        proof->create_injectivity_constraints(first.size(), second.size());

        // generate edge constraints, and also handle loops here
        for (int p = 0; p < first.size(); ++p) {
            for (int t = 0; t < second.size(); ++t) {
                if (first.adjacent(p, p) != second.adjacent(t, t))
                    proof->create_forbidden_assignment_constraint(p, t);
                else if (first.vertex_label(p) != second.vertex_label(t))
                    proof->create_forbidden_assignment_constraint(p, t);
                else {
                    proof->start_adjacency_constraints_for(p, t);

                    // if p can be mapped to t, then each (non-)neighbour of p...
                    for (int q = 0; q < first.size(); ++q)
                        if (q != p) {
                            // ... must be mapped to a (non-)neighbour of t
                            vector<int> permitted;
                            for (int u = 0; u < second.size(); ++u)
                                if (t != u && first.adjacent(p, q) == second.adjacent(t, u))
                                    permitted.push_back(u);
                            // or null
                            permitted.push_back(second.size());
                            proof->create_adjacency_constraint(p, q, t, permitted, vector<int>{}, false);
                        }
                }
            }
        }

        if (params.connected)
            proof->create_connected_constraints(first.size(), second.size(), [&](int a, int b) { return first.adjacent(a, b); });

        // output the model file
        proof->finalise_model();

        // rewrite the objective to the form we need
        if (! params.decide) {
            vector<tuple<NamedVertex, NamedVertex, bool>> solution;
            for (int v = 0; v < first.size(); ++v)
                for (int w = 0; w < second.size(); ++w)
                    solution.emplace_back(
                        NamedVertex{v, first.vertex_name(v)},
                        NamedVertex{w, second.vertex_name(w)},
                        false);
            proof->new_incumbent(solution);
            proof->rewrite_mcs_objective(first.size());
        }
    }

    if (params.clique) {
        CliqueParams clique_params;
        clique_params.timeout = params.timeout;
        clique_params.start_time = params.start_time;
        clique_params.decide = params.decide;
        clique_params.restarts_schedule = make_unique<NoRestartsSchedule>();
        clique_params.adjust_objective_for_mcs = make_optional(first.size());

        InputGraph assoc{0, false, false};
        vector<pair<int, int>> assoc_encoding, zero_in_proof_objectives;

        for (int v = 0; v < first.size(); ++v)
            for (int w = 0; w < second.size(); ++w)
                if ((first.adjacent(v, v) == second.adjacent(w, w)) && (first.vertex_label(v) == second.vertex_label(w)))
                    assoc_encoding.emplace_back(v, w);
                else if (proof)
                    zero_in_proof_objectives.emplace_back(v, w);

        if (proof)
            proof->create_clique_encoding(assoc_encoding, zero_in_proof_objectives);

        assoc.resize(assoc_encoding.size());
        for (unsigned v = 0; v < assoc_encoding.size(); ++v)
            for (unsigned w = 0; w < assoc_encoding.size(); ++w)
                if (v != w) {
                    auto [vf, vs] = assoc_encoding[v];
                    auto [wf, ws] = assoc_encoding[w];
                    bool edge = false;
                    if (vf != wf && vs != ws && first.adjacent(vf, wf) == second.adjacent(vs, ws)) {
                        if ((! first.adjacent(vf, wf)) || (first.edge_label(vf, wf) == second.edge_label(vs, ws))) {
                            edge = true;
                            assoc.add_edge(v, w);
                        }
                    }

                    if (proof && ! edge)
                        proof->create_clique_nonedge(v, w);
                }

        clique_params.extend_proof = proof;

        if (params.connected) {
            clique_params.connected = [&](int x, const function<auto(int)->int> & invorder) -> SVOBitset {
                auto [f, _] = assoc_encoding[x];
                SVOBitset v(assoc_encoding.size(), 0);
                v.reset();
                for (unsigned y = 0; y < assoc_encoding.size(); ++y)
                    if (first.adjacent(f, assoc_encoding[y].first))
                        v.set(invorder(y));
                return v;
            };
        }

        auto clique_result = solve_clique_problem(assoc, clique_params);

        // now translate the result back into what we expect
        CommonSubgraphResult result;
        for (auto & m : clique_result.clique)
            result.mapping.emplace(assoc_encoding[m]);
        result.nodes = clique_result.nodes;
        result.extra_stats = move(clique_result.extra_stats);
        result.extra_stats.emplace_back("used_clique_solver = true");
        result.complete = clique_result.complete;

        return result;
    }
    else {
        CommonSubgraphRunner runner{first, second, params, proof};
        return runner.run();
    }
}